

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  byte *pbVar1;
  ErrorCollector *pEVar2;
  bool bVar3;
  int iVar4;
  SourceCodeInfo *this_00;
  byte bVar5;
  LocationRecorder root_location;
  SourceCodeInfo source_code_info;
  LocationRecorder local_90;
  long *local_80 [2];
  long local_70 [2];
  SourceCodeInfo local_60;
  
  this->input_ = input;
  this->had_errors_ = false;
  (this->syntax_identifier_)._M_string_length = 0;
  *(this->syntax_identifier_)._M_dataplus._M_p = '\0';
  SourceCodeInfo::SourceCodeInfo(&local_60);
  this->source_code_info_ = &local_60;
  if ((this->input_->current_).type == TYPE_START) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0,&this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder(&local_90,this);
  if (this->require_syntax_identifier_ == false) {
    iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar4 == 0) goto LAB_00214c6e;
    if (this->stop_after_syntax_identifier_ == false) {
      std::__cxx11::string::_M_replace
                ((ulong)&this->syntax_identifier_,0,
                 (char *)(this->syntax_identifier_)._M_string_length,0x250df7);
    }
LAB_00214c7a:
    if (this->stop_after_syntax_identifier_ == false) {
      if ((this->input_->current_).type != TYPE_END) {
        do {
          bVar3 = ParseTopLevelStatement(this,file,&local_90);
          if (!bVar3) {
            SkipStatement(this);
            iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar4 == 0) {
              local_80[0] = local_70;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_80,"Unmatched \"}\".","");
              pEVar2 = this->error_collector_;
              if (pEVar2 != (ErrorCollector *)0x0) {
                (*pEVar2->_vptr_ErrorCollector[2])
                          (pEVar2,(ulong)(uint)(this->input_->current_).line,
                           (ulong)(uint)(this->input_->current_).column,local_80);
              }
              this->had_errors_ = true;
              if (local_80[0] != local_70) {
                operator_delete(local_80[0],local_70[0] + 1);
              }
              io::Tokenizer::NextWithComments
                        (this->input_,(string *)0x0,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0x0,&this->upcoming_doc_comments_);
            }
          }
        } while ((this->input_->current_).type != TYPE_END);
      }
      LocationRecorder::~LocationRecorder(&local_90);
      this->input_ = (Tokenizer *)0x0;
      this->source_code_info_ = (SourceCodeInfo *)0x0;
      pbVar1 = (byte *)((long)file->_has_bits_ + 1);
      *pbVar1 = *pbVar1 | 4;
      this_00 = file->source_code_info_;
      if (this_00 == (SourceCodeInfo *)0x0) {
        this_00 = (SourceCodeInfo *)operator_new(0x30);
        SourceCodeInfo::SourceCodeInfo(this_00);
        file->source_code_info_ = this_00;
      }
      SourceCodeInfo::Swap(&local_60,this_00);
      bVar5 = this->had_errors_ ^ 1;
      goto LAB_00214dad;
    }
    bVar5 = this->had_errors_ ^ 1;
  }
  else {
LAB_00214c6e:
    bVar3 = ParseSyntaxIdentifier(this);
    if (bVar3) goto LAB_00214c7a;
    bVar5 = 0;
  }
  LocationRecorder::~LocationRecorder(&local_90);
LAB_00214dad:
  SourceCodeInfo::~SourceCodeInfo(&local_60);
  return (bool)bVar5;
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(NULL, NULL, &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);

    if (require_syntax_identifier_ || LookingAt("syntax")) {
      if (!ParseSyntaxIdentifier()) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
    } else if (!stop_after_syntax_identifier_) {
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          AddError("Unmatched \"}\".");
          input_->NextWithComments(NULL, NULL, &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = NULL;
  source_code_info_ = NULL;
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}